

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int checkTreePage(IntegrityCk *pCheck,Pgno iPage,i64 *piMinKey,i64 maxKey)

{
  long lVar1;
  BtShared *pBVar2;
  long lVar3;
  bool bVar4;
  bool bVar5;
  ushort uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  u8 *p;
  undefined1 *in_RCX;
  undefined8 *in_RDX;
  uint in_ESI;
  IntegrityCk *in_RDI;
  long in_FS_OFFSET;
  bool bVar16;
  int j;
  int size_1;
  u32 size;
  Pgno pgnoOvfl;
  u32 nPage;
  u8 savedIsInit;
  int saved_v2;
  int saved_v1;
  char *saved_zPfx;
  u32 prev;
  u32 *heap;
  u32 contentOffset;
  u32 usableSize;
  u32 pc;
  BtShared *pBt;
  u8 *pCellIdx;
  u8 *pCell;
  u8 *data;
  int keyCanBeEqual;
  int doCoverageCheck;
  int nCell;
  int cellStart;
  int hdr;
  int nFrag;
  int pgno;
  int d2;
  int depth;
  int rc;
  int i;
  CellInfo info;
  u32 x;
  MemPage *pPage;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff10;
  Pgno in_stack_ffffffffffffff14;
  undefined4 in_stack_ffffffffffffff18;
  u32 in_stack_ffffffffffffff1c;
  uint in_stack_ffffffffffffff20;
  uint3 in_stack_ffffffffffffff24;
  uint pgno_00;
  Pgno iPage_00;
  Pgno isFreeList;
  IntegrityCk *pCheck_00;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 uVar17;
  u32 *local_c0;
  undefined1 *local_a0;
  int local_70;
  int local_64;
  undefined4 uVar18;
  uint uVar19;
  undefined4 in_stack_ffffffffffffffb0;
  int local_3c;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined8 local_28;
  u32 local_1c;
  undefined1 *maxKey_00;
  undefined1 *local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  maxKey_00 = (undefined1 *)0x0;
  uVar18 = 0xaaaaaaaa;
  local_64 = -1;
  bVar5 = true;
  bVar4 = true;
  local_c0 = (u32 *)0x0;
  local_1c = 0xaaaaaaaa;
  uVar17 = 0;
  pCheck_00 = (IntegrityCk *)in_RDI->zPfx;
  isFreeList = in_RDI->v1;
  iPage_00 = in_RDI->v2;
  pgno_00 = (uint)in_stack_ffffffffffffff24;
  checkProgress((IntegrityCk *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  if (in_RDI->mxErr != 0) {
    pBVar2 = in_RDI->pBt;
    uVar15 = pBVar2->usableSize;
    if (in_ESI == 0) {
      local_3c = 0;
      goto LAB_0019fd0d;
    }
    iVar7 = checkRef((IntegrityCk *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),0)
    ;
    if (iVar7 != 0) {
      local_3c = 0;
      goto LAB_0019fd0d;
    }
    in_RDI->zPfx = "Tree %u page %u: ";
    in_RDI->v1 = in_ESI;
    uVar8 = btreeGetPage((BtShared *)CONCAT44(isFreeList,iPage_00),pgno_00,
                         (MemPage **)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                         in_stack_ffffffffffffff14);
    if (uVar8 == 0) {
      pgno_00 = CONCAT13(*maxKey_00,(int3)pgno_00);
      *maxKey_00 = 0;
      uVar8 = btreeInitPage((MemPage *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18)
                           );
      if (uVar8 == 0) {
        uVar8 = btreeComputeFreeSpace((MemPage *)CONCAT44(uVar17,in_stack_ffffffffffffff38));
        if (uVar8 == 0) {
          lVar3 = *(long *)(maxKey_00 + 0x50);
          uVar9 = (uint)(byte)maxKey_00[9];
          in_RDI->zPfx = "Tree %u page %u cell %u: ";
          uVar10 = CONCAT11(*(undefined1 *)(lVar3 + (int)(uVar9 + 5)),
                            *(undefined1 *)(lVar3 + 1 + (long)(int)(uVar9 + 5))) - 1 & 0xffff;
          uVar11 = uVar10 + 1;
          uVar12 = (uint)CONCAT11(*(undefined1 *)(lVar3 + (int)(uVar9 + 3)),
                                  *(undefined1 *)(lVar3 + 1 + (long)(int)(uVar9 + 3)));
          if ((maxKey_00[8] != '\0') || (maxKey_00[1] == '\0')) {
            in_RDI->nRow = (long)(int)uVar12 + in_RDI->nRow;
          }
          iVar7 = uVar9 + 0xc + (uint)(byte)maxKey_00[8] * -4;
          local_a0 = (undefined1 *)(lVar3 + (int)(iVar7 + (uVar12 - 1) * 2));
          local_10 = in_RCX;
          uVar19 = uVar12;
          if (maxKey_00[8] == '\0') {
            sqlite3Get4byte((u8 *)(lVar3 + (int)(uVar9 + 8)));
            if (pBVar2->autoVacuum != '\0') {
              in_RDI->zPfx = "Tree %u page %u right child: ";
              checkPtrmap((IntegrityCk *)CONCAT44(pgno_00,in_stack_ffffffffffffff20),
                          in_stack_ffffffffffffff1c,(u8)((uint)in_stack_ffffffffffffff18 >> 0x18),
                          in_stack_ffffffffffffff14);
            }
            local_64 = checkTreePage((IntegrityCk *)CONCAT44(in_ESI,in_stack_ffffffffffffffb0),
                                     (Pgno)((ulong)in_RDX >> 0x20),(i64 *)CONCAT44(uVar18,uVar8),
                                     (i64)maxKey_00);
            bVar4 = false;
          }
          else {
            local_c0 = in_RDI->heap;
            *local_c0 = 0;
          }
          while( true ) {
            uVar19 = uVar19 - 1;
            bVar16 = false;
            if (-1 < (int)uVar19) {
              bVar16 = in_RDI->mxErr != 0;
            }
            if (!bVar16) break;
            local_38 = &DAT_aaaaaaaaaaaaaaaa;
            local_30 = &DAT_aaaaaaaaaaaaaaaa;
            local_28 = &DAT_aaaaaaaaaaaaaaaa;
            in_RDI->v2 = uVar19;
            uVar13 = (uint)CONCAT11(*local_a0,local_a0[1]);
            local_a0 = local_a0 + -2;
            if ((uVar13 < uVar11) || (uVar15 - 4 < uVar13)) {
              checkAppendMsg(in_RDI,"Offset %u out of range %u..%u",(ulong)uVar13,(ulong)uVar11,
                             (ulong)(uVar15 - 4));
              bVar5 = false;
            }
            else {
              p = (u8 *)(lVar3 + (ulong)uVar13);
              (**(code **)(maxKey_00 + 0x80))(maxKey_00,p,&local_38);
              if (uVar15 < uVar13 + local_28._6_2_) {
                checkAppendMsg(in_RDI,"Extends off end of page");
                bVar5 = false;
              }
              else {
                if (maxKey_00[1] != '\0') {
                  if (bVar4) {
                    if ((long)local_10 < (long)local_38) {
LAB_0019f784:
                      checkAppendMsg(in_RDI,"Rowid %lld out of order",local_38);
                    }
                  }
                  else if ((long)local_10 <= (long)local_38) goto LAB_0019f784;
                  local_10 = local_38;
                  bVar4 = false;
                }
                if (local_28._4_2_ < (uint)local_28) {
                  in_stack_ffffffffffffff20 =
                       ((((uint)local_28 - local_28._4_2_) + uVar15) - 5) / (uVar15 - 4);
                  in_stack_ffffffffffffff1c = sqlite3Get4byte(p + (int)(local_28._6_2_ - 4));
                  if (pBVar2->autoVacuum != '\0') {
                    checkPtrmap((IntegrityCk *)CONCAT44(pgno_00,in_stack_ffffffffffffff20),
                                in_stack_ffffffffffffff1c,
                                (u8)((uint)in_stack_ffffffffffffff18 >> 0x18),
                                in_stack_ffffffffffffff14);
                  }
                  checkList(pCheck_00,isFreeList,iPage_00,pgno_00);
                }
                if (maxKey_00[8] == '\0') {
                  sqlite3Get4byte(p);
                  if (pBVar2->autoVacuum != '\0') {
                    checkPtrmap((IntegrityCk *)CONCAT44(pgno_00,in_stack_ffffffffffffff20),
                                in_stack_ffffffffffffff1c,
                                (u8)((uint)in_stack_ffffffffffffff18 >> 0x18),
                                in_stack_ffffffffffffff14);
                  }
                  iVar14 = checkTreePage((IntegrityCk *)CONCAT44(in_ESI,in_stack_ffffffffffffffb0),
                                         (Pgno)((ulong)in_RDX >> 0x20),(i64 *)CONCAT44(uVar19,uVar8)
                                         ,(i64)maxKey_00);
                  bVar4 = false;
                  if (iVar14 != local_64) {
                    checkAppendMsg(in_RDI,"Child page depth differs");
                    local_64 = iVar14;
                  }
                }
                else {
                  btreeHeapInsert(local_c0,uVar13 << 0x10 | (uVar13 + local_28._6_2_) - 1);
                }
              }
            }
          }
          *in_RDX = local_10;
          in_RDI->zPfx = (char *)0x0;
          if ((bVar5) && (0 < in_RDI->mxErr)) {
            if (maxKey_00[8] == '\0') {
              local_c0 = in_RDI->heap;
              *local_c0 = 0;
              while (uVar12 = uVar12 - 1, -1 < (int)uVar12) {
                uVar8 = (uint)CONCAT11(*(undefined1 *)(lVar3 + (int)(iVar7 + uVar12 * 2)),
                                       *(undefined1 *)(lVar3 + 1 + (long)(int)(iVar7 + uVar12 * 2)))
                ;
                uVar6 = (**(code **)(maxKey_00 + 0x78))(maxKey_00,lVar3 + (ulong)uVar8);
                btreeHeapInsert(local_c0,uVar8 << 0x10 | (uVar8 + uVar6) - 1);
              }
            }
            uVar6 = CONCAT11(*(undefined1 *)(lVar3 + (int)(uVar9 + 1)),
                             *(undefined1 *)(lVar3 + 1 + (long)(int)(uVar9 + 1)));
            while (uVar8 = (uint)uVar6, uVar8 != 0) {
              btreeHeapInsert(local_c0,uVar8 << 0x10 |
                                       (uVar8 + CONCAT11(*(undefined1 *)(lVar3 + (int)(uVar8 + 2)),
                                                         *(undefined1 *)
                                                          (lVar3 + 1 + (long)(int)(uVar8 + 2)))) - 1
                             );
              uVar6 = CONCAT11(*(undefined1 *)(lVar3 + (int)uVar8),
                               *(undefined1 *)(lVar3 + 1 + (long)(int)uVar8));
            }
            local_70 = 0;
            while (iVar7 = btreeHeapPull(local_c0,&local_1c), iVar7 != 0) {
              if (local_1c >> 0x10 <= (uVar10 & 0xffff)) {
                checkAppendMsg(in_RDI,"Multiple uses for byte %u of page %u",
                               (ulong)(local_1c >> 0x10),(ulong)in_ESI);
                break;
              }
              local_70 = ((local_1c >> 0x10) - (uVar10 & 0xffff)) + -1 + local_70;
              uVar10 = local_1c;
            }
            uVar15 = (uVar15 - (uVar10 & 0xffff)) + -1 + local_70;
            if ((*local_c0 == 0) && (uVar15 != *(byte *)(lVar3 + (int)(uVar9 + 7)))) {
              checkAppendMsg(in_RDI,"Fragmentation of %u bytes reported as %u on page %u",
                             (ulong)uVar15,(ulong)*(byte *)(lVar3 + (int)(uVar9 + 7)),(ulong)in_ESI)
              ;
            }
          }
        }
        else {
          checkAppendMsg(in_RDI,"free space corruption",(ulong)uVar8);
        }
      }
      else {
        checkAppendMsg(in_RDI,"btreeInitPage() returns error code %d",(ulong)uVar8);
      }
    }
    else {
      checkAppendMsg(in_RDI,"unable to get the page. error code=%d",(ulong)uVar8);
      if (uVar8 == 0xc0a) {
        in_RDI->rc = 7;
      }
    }
  }
  if (!bVar5) {
    *maxKey_00 = (char)(pgno_00 >> 0x18);
  }
  releasePage((MemPage *)0x19fccd);
  in_RDI->zPfx = (char *)pCheck_00;
  in_RDI->v1 = isFreeList;
  in_RDI->v2 = iPage_00;
  local_3c = local_64 + 1;
LAB_0019fd0d:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_3c;
}

Assistant:

static int checkTreePage(
  IntegrityCk *pCheck,  /* Context for the sanity check */
  Pgno iPage,           /* Page number of the page to check */
  i64 *piMinKey,        /* Write minimum integer primary key here */
  i64 maxKey            /* Error if integer primary key greater than this */
){
  MemPage *pPage = 0;      /* The page being analyzed */
  int i;                   /* Loop counter */
  int rc;                  /* Result code from subroutine call */
  int depth = -1, d2;      /* Depth of a subtree */
  int pgno;                /* Page number */
  int nFrag;               /* Number of fragmented bytes on the page */
  int hdr;                 /* Offset to the page header */
  int cellStart;           /* Offset to the start of the cell pointer array */
  int nCell;               /* Number of cells */
  int doCoverageCheck = 1; /* True if cell coverage checking should be done */
  int keyCanBeEqual = 1;   /* True if IPK can be equal to maxKey
                           ** False if IPK must be strictly less than maxKey */
  u8 *data;                /* Page content */
  u8 *pCell;               /* Cell content */
  u8 *pCellIdx;            /* Next element of the cell pointer array */
  BtShared *pBt;           /* The BtShared object that owns pPage */
  u32 pc;                  /* Address of a cell */
  u32 usableSize;          /* Usable size of the page */
  u32 contentOffset;       /* Offset to the start of the cell content area */
  u32 *heap = 0;           /* Min-heap used for checking cell coverage */
  u32 x, prev = 0;         /* Next and previous entry on the min-heap */
  const char *saved_zPfx = pCheck->zPfx;
  int saved_v1 = pCheck->v1;
  int saved_v2 = pCheck->v2;
  u8 savedIsInit = 0;

  /* Check that the page exists
  */
  checkProgress(pCheck);
  if( pCheck->mxErr==0 ) goto end_of_check;
  pBt = pCheck->pBt;
  usableSize = pBt->usableSize;
  if( iPage==0 ) return 0;
  if( checkRef(pCheck, iPage) ) return 0;
  pCheck->zPfx = "Tree %u page %u: ";
  pCheck->v1 = iPage;
  if( (rc = btreeGetPage(pBt, iPage, &pPage, 0))!=0 ){
    checkAppendMsg(pCheck,
       "unable to get the page. error code=%d", rc);
    if( rc==SQLITE_IOERR_NOMEM ) pCheck->rc = SQLITE_NOMEM;
    goto end_of_check;
  }

  /* Clear MemPage.isInit to make sure the corruption detection code in
  ** btreeInitPage() is executed.  */
  savedIsInit = pPage->isInit;
  pPage->isInit = 0;
  if( (rc = btreeInitPage(pPage))!=0 ){
    assert( rc==SQLITE_CORRUPT );  /* The only possible error from InitPage */
    checkAppendMsg(pCheck,
                   "btreeInitPage() returns error code %d", rc);
    goto end_of_check;
  }
  if( (rc = btreeComputeFreeSpace(pPage))!=0 ){
    assert( rc==SQLITE_CORRUPT );
    checkAppendMsg(pCheck, "free space corruption", rc);
    goto end_of_check;
  }
  data = pPage->aData;
  hdr = pPage->hdrOffset;

  /* Set up for cell analysis */
  pCheck->zPfx = "Tree %u page %u cell %u: ";
  contentOffset = get2byteNotZero(&data[hdr+5]);
  assert( contentOffset<=usableSize );  /* Enforced by btreeInitPage() */

  /* EVIDENCE-OF: R-37002-32774 The two-byte integer at offset 3 gives the
  ** number of cells on the page. */
  nCell = get2byte(&data[hdr+3]);
  assert( pPage->nCell==nCell );
  if( pPage->leaf || pPage->intKey==0 ){
    pCheck->nRow += nCell;
  }

  /* EVIDENCE-OF: R-23882-45353 The cell pointer array of a b-tree page
  ** immediately follows the b-tree page header. */
  cellStart = hdr + 12 - 4*pPage->leaf;
  assert( pPage->aCellIdx==&data[cellStart] );
  pCellIdx = &data[cellStart + 2*(nCell-1)];

  if( !pPage->leaf ){
    /* Analyze the right-child page of internal pages */
    pgno = get4byte(&data[hdr+8]);
#ifndef SQLITE_OMIT_AUTOVACUUM
    if( pBt->autoVacuum ){
      pCheck->zPfx = "Tree %u page %u right child: ";
      checkPtrmap(pCheck, pgno, PTRMAP_BTREE, iPage);
    }
#endif
    depth = checkTreePage(pCheck, pgno, &maxKey, maxKey);
    keyCanBeEqual = 0;
  }else{
    /* For leaf pages, the coverage check will occur in the same loop
    ** as the other cell checks, so initialize the heap.  */
    heap = pCheck->heap;
    heap[0] = 0;
  }

  /* EVIDENCE-OF: R-02776-14802 The cell pointer array consists of K 2-byte
  ** integer offsets to the cell contents. */
  for(i=nCell-1; i>=0 && pCheck->mxErr; i--){
    CellInfo info;

    /* Check cell size */
    pCheck->v2 = i;
    assert( pCellIdx==&data[cellStart + i*2] );
    pc = get2byteAligned(pCellIdx);
    pCellIdx -= 2;
    if( pc<contentOffset || pc>usableSize-4 ){
      checkAppendMsg(pCheck, "Offset %u out of range %u..%u",
                             pc, contentOffset, usableSize-4);
      doCoverageCheck = 0;
      continue;
    }
    pCell = &data[pc];
    pPage->xParseCell(pPage, pCell, &info);
    if( pc+info.nSize>usableSize ){
      checkAppendMsg(pCheck, "Extends off end of page");
      doCoverageCheck = 0;
      continue;
    }

    /* Check for integer primary key out of range */
    if( pPage->intKey ){
      if( keyCanBeEqual ? (info.nKey > maxKey) : (info.nKey >= maxKey) ){
        checkAppendMsg(pCheck, "Rowid %lld out of order", info.nKey);
      }
      maxKey = info.nKey;
      keyCanBeEqual = 0;     /* Only the first key on the page may ==maxKey */
    }

    /* Check the content overflow list */
    if( info.nPayload>info.nLocal ){
      u32 nPage;       /* Number of pages on the overflow chain */
      Pgno pgnoOvfl;   /* First page of the overflow chain */
      assert( pc + info.nSize - 4 <= usableSize );
      nPage = (info.nPayload - info.nLocal + usableSize - 5)/(usableSize - 4);
      pgnoOvfl = get4byte(&pCell[info.nSize - 4]);
#ifndef SQLITE_OMIT_AUTOVACUUM
      if( pBt->autoVacuum ){
        checkPtrmap(pCheck, pgnoOvfl, PTRMAP_OVERFLOW1, iPage);
      }
#endif
      checkList(pCheck, 0, pgnoOvfl, nPage);
    }

    if( !pPage->leaf ){
      /* Check sanity of left child page for internal pages */
      pgno = get4byte(pCell);
#ifndef SQLITE_OMIT_AUTOVACUUM
      if( pBt->autoVacuum ){
        checkPtrmap(pCheck, pgno, PTRMAP_BTREE, iPage);
      }
#endif
      d2 = checkTreePage(pCheck, pgno, &maxKey, maxKey);
      keyCanBeEqual = 0;
      if( d2!=depth ){
        checkAppendMsg(pCheck, "Child page depth differs");
        depth = d2;
      }
    }else{
      /* Populate the coverage-checking heap for leaf pages */
      btreeHeapInsert(heap, (pc<<16)|(pc+info.nSize-1));
    }
  }
  *piMinKey = maxKey;

  /* Check for complete coverage of the page
  */
  pCheck->zPfx = 0;
  if( doCoverageCheck && pCheck->mxErr>0 ){
    /* For leaf pages, the min-heap has already been initialized and the
    ** cells have already been inserted.  But for internal pages, that has
    ** not yet been done, so do it now */
    if( !pPage->leaf ){
      heap = pCheck->heap;
      heap[0] = 0;
      for(i=nCell-1; i>=0; i--){
        u32 size;
        pc = get2byteAligned(&data[cellStart+i*2]);
        size = pPage->xCellSize(pPage, &data[pc]);
        btreeHeapInsert(heap, (pc<<16)|(pc+size-1));
      }
    }
    assert( heap!=0 );
    /* Add the freeblocks to the min-heap
    **
    ** EVIDENCE-OF: R-20690-50594 The second field of the b-tree page header
    ** is the offset of the first freeblock, or zero if there are no
    ** freeblocks on the page.
    */
    i = get2byte(&data[hdr+1]);
    while( i>0 ){
      int size, j;
      assert( (u32)i<=usableSize-4 ); /* Enforced by btreeComputeFreeSpace() */
      size = get2byte(&data[i+2]);
      assert( (u32)(i+size)<=usableSize ); /* due to btreeComputeFreeSpace() */
      btreeHeapInsert(heap, (((u32)i)<<16)|(i+size-1));
      /* EVIDENCE-OF: R-58208-19414 The first 2 bytes of a freeblock are a
      ** big-endian integer which is the offset in the b-tree page of the next
      ** freeblock in the chain, or zero if the freeblock is the last on the
      ** chain. */
      j = get2byte(&data[i]);
      /* EVIDENCE-OF: R-06866-39125 Freeblocks are always connected in order of
      ** increasing offset. */
      assert( j==0 || j>i+size );     /* Enforced by btreeComputeFreeSpace() */
      assert( (u32)j<=usableSize-4 ); /* Enforced by btreeComputeFreeSpace() */
      i = j;
    }
    /* Analyze the min-heap looking for overlap between cells and/or
    ** freeblocks, and counting the number of untracked bytes in nFrag.
    **
    ** Each min-heap entry is of the form:    (start_address<<16)|end_address.
    ** There is an implied first entry the covers the page header, the cell
    ** pointer index, and the gap between the cell pointer index and the start
    ** of cell content.
    **
    ** The loop below pulls entries from the min-heap in order and compares
    ** the start_address against the previous end_address.  If there is an
    ** overlap, that means bytes are used multiple times.  If there is a gap,
    ** that gap is added to the fragmentation count.
    */
    nFrag = 0;
    prev = contentOffset - 1;   /* Implied first min-heap entry */
    while( btreeHeapPull(heap,&x) ){
      if( (prev&0xffff)>=(x>>16) ){
        checkAppendMsg(pCheck,
          "Multiple uses for byte %u of page %u", x>>16, iPage);
        break;
      }else{
        nFrag += (x>>16) - (prev&0xffff) - 1;
        prev = x;
      }
    }
    nFrag += usableSize - (prev&0xffff) - 1;
    /* EVIDENCE-OF: R-43263-13491 The total number of bytes in all fragments
    ** is stored in the fifth field of the b-tree page header.
    ** EVIDENCE-OF: R-07161-27322 The one-byte integer at offset 7 gives the
    ** number of fragmented free bytes within the cell content area.
    */
    if( heap[0]==0 && nFrag!=data[hdr+7] ){
      checkAppendMsg(pCheck,
          "Fragmentation of %u bytes reported as %u on page %u",
          nFrag, data[hdr+7], iPage);
    }
  }

end_of_check:
  if( !doCoverageCheck ) pPage->isInit = savedIsInit;
  releasePage(pPage);
  pCheck->zPfx = saved_zPfx;
  pCheck->v1 = saved_v1;
  pCheck->v2 = saved_v2;
  return depth+1;
}